

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall duckdb::DataTable::AppendLock(DataTable *this,TableAppendState *state)

{
  RowGroupCollection *this_00;
  idx_t val;
  long lVar1;
  TransactionException *this_01;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&local_80,&this->append_lock);
  ::std::unique_lock<std::mutex>::operator=
            (&state->append_lock,(unique_lock<std::mutex> *)&local_80);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_80);
  if ((this->version)._M_i == MAIN_TABLE) {
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
    val = RowGroupCollection::GetTotalRows(this_00);
    lVar1 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
    state->row_start = lVar1;
    state->current_row = lVar1;
    return;
  }
  this_01 = (TransactionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_80,
             "Transaction conflict: attempting to insert into table \"%s\" but it has been %s by a different transaction"
             ,&local_81);
  GetTableName_abi_cxx11_(&local_40,this);
  TableModification_abi_cxx11_(&local_60,this);
  TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
            (this_01,&local_80,&local_40,&local_60);
  __cxa_throw(this_01,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::AppendLock(TableAppendState &state) {
	state.append_lock = unique_lock<mutex>(append_lock);
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to insert into table \"%s\" but it has been %s by "
		                           "a different transaction",
		                           GetTableName(), TableModification());
	}
	state.row_start = NumericCast<row_t>(row_groups->GetTotalRows());
	state.current_row = state.row_start;
}